

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O0

void __thiscall
Formula_Context::Note_Changed(Formula_Context *this,Am_Object_Advanced *object,Am_Slot_Key key)

{
  Am_Slot_Key AVar1;
  bool bVar2;
  Am_Slot_Key AVar3;
  bool bVar4;
  Am_Object local_28;
  Am_Slot_Key local_1a;
  Am_Object_Advanced *pAStack_18;
  Am_Slot_Key key_local;
  Am_Object_Advanced *object_local;
  Formula_Context *this_local;
  
  local_1a = key;
  pAStack_18 = object;
  object_local = (Am_Object_Advanced *)this;
  Am_Slot::Get_Owner((Am_Slot *)&local_28);
  bVar2 = Am_Object::operator==(&object->super_Am_Object,&local_28);
  AVar1 = local_1a;
  bVar4 = false;
  if (bVar2) {
    AVar3 = Am_Slot::Get_Key(&this->depender);
    bVar4 = AVar1 == AVar3;
  }
  Am_Object_Advanced::~Am_Object_Advanced((Am_Object_Advanced *)&local_28);
  if (bVar4) {
    this->changed = true;
  }
  else {
    (*Am_Empty_Constraint_Context->_vptr_Am_Constraint_Context[3])
              (Am_Empty_Constraint_Context,pAStack_18,(ulong)local_1a);
  }
  return;
}

Assistant:

void
Formula_Context::Note_Changed(const Am_Object_Advanced &object, Am_Slot_Key key)
{
  if ((object == depender.Get_Owner()) && (key == depender.Get_Key()))
    changed = true;
  else
    Am_Empty_Constraint_Context->Note_Changed(object, key);
}